

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O0

HANDLE CreateSemaphoreA(LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,LONG lInitialCount,
                       LONG lMaximumCount,LPCSTR lpName)

{
  CPalThread *pthr_00;
  DWORD local_34;
  PAL_ERROR palError;
  CPalThread *pthr;
  HANDLE hSemaphore;
  LPCSTR lpName_local;
  LONG lMaximumCount_local;
  LONG lInitialCount_local;
  LPSECURITY_ATTRIBUTES lpSemaphoreAttributes_local;
  
  pthr = (CPalThread *)0x0;
  hSemaphore = lpName;
  lpName_local._0_4_ = lMaximumCount;
  lpName_local._4_4_ = lInitialCount;
  _lMaximumCount_local = lpSemaphoreAttributes;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pthr_00 = CorUnix::InternalGetCurrentThread();
  if (hSemaphore == (HANDLE)0x0) {
    local_34 = CorUnix::InternalCreateSemaphore
                         (pthr_00,_lMaximumCount_local,lpName_local._4_4_,(LONG)lpName_local,
                          (LPCWSTR)0x0,&pthr);
  }
  else {
    fprintf(_stderr,"] %s %s:%d","CreateSemaphoreA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x82);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    local_34 = 0x32;
  }
  CorUnix::CPalThread::SetLastError(local_34);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return pthr;
}

Assistant:

HANDLE
PALAPI
CreateSemaphoreA(
         IN LPSECURITY_ATTRIBUTES lpSemaphoreAttributes,
         IN LONG lInitialCount,
         IN LONG lMaximumCount,
         IN LPCSTR lpName)
{
    HANDLE hSemaphore = NULL;
    CPalThread *pthr = NULL;
    PAL_ERROR palError;

    PERF_ENTRY(CreateSemaphoreA);
    ENTRY("CreateSemaphoreA(lpSemaphoreAttributes=%p, lInitialCount=%d, "
          "lMaximumCount=%d, lpName=%p (%s))\n",
          lpSemaphoreAttributes, lInitialCount, lMaximumCount, lpName, lpName?lpName:"NULL");

    pthr = InternalGetCurrentThread();

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }
    else
    {
        palError = InternalCreateSemaphore(
            pthr,
            lpSemaphoreAttributes,
            lInitialCount,
            lMaximumCount,
            NULL,
            &hSemaphore
            );
    }

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pthr->SetLastError(palError);

    LOGEXIT("CreateSemaphoreA returns HANDLE %p\n", hSemaphore);
    PERF_EXIT(CreateSemaphoreA);
    return hSemaphore;
}